

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_2dVector * __thiscall ON_2dVector::operator=(ON_2dVector *this,double *v)

{
  double dVar1;
  
  if (v == (double *)0x0) {
    this->x = 0.0;
    dVar1 = 0.0;
  }
  else {
    this->x = *v;
    dVar1 = v[1];
  }
  this->y = dVar1;
  return this;
}

Assistant:

ON_2dVector& ON_2dVector::operator=(const double* v)
{
  if ( v ) {
    x = v[0];
    y = v[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}